

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O2

bool __thiscall Clasp::Asp::LogicProgram::propagate(LogicProgram *this,bool backprop)

{
  uint uVar1;
  size_type sVar2;
  PrgAtom *this_00;
  PrgNode PVar3;
  SharedContext *this_01;
  bool bVar4;
  Literal x;
  uint uVar5;
  
  uVar1 = *(uint *)&(this->opts_).field_0x4;
  *(uint *)&(this->opts_).field_0x4 = uVar1 & 0xdfffffff | (uint)backprop << 0x1d;
  uVar5 = 0;
  do {
    sVar2 = (this->propQ_).ebo_.size;
    if (uVar5 == sVar2) {
      *(uint *)&(this->opts_).field_0x4 =
           *(uint *)&(this->opts_).field_0x4 & 0xdfffffff | uVar1 & 0x20000000;
      (this->propQ_).ebo_.size = 0;
LAB_0013b805:
      return uVar5 == sVar2;
    }
    this_00 = (this->atoms_).ebo_.buf[(this->propQ_).ebo_.buf[uVar5]];
    if (((this_00->super_PrgHead).super_PrgNode.field_0x7 & 0x40) == 0) {
      bVar4 = PrgAtom::propagateValue(this_00,this,backprop);
      if (!bVar4) {
LAB_0013b7fd:
        setConflict(this);
        goto LAB_0013b805;
      }
      PVar3 = (this_00->super_PrgHead).super_PrgNode;
      if (((PVar3._0_4_ & 0x7fffffff) != 1) && ((PVar3._4_4_ & 0xfffffff) < (this->input_).lo)) {
        this_01 = (this->super_ProgramBuilder).ctx_;
        x = PrgNode::trueLit((PrgNode *)this_00);
        bVar4 = SharedContext::addUnary(this_01,x);
        if (!bVar4) goto LAB_0013b7fd;
      }
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

bool LogicProgram::propagate(bool backprop) {
	assert(frozen());
	bool oldB = opts_.backprop != 0;
	opts_.backprop = backprop;
	for (VarVec::size_type i = 0; i != propQ_.size(); ++i) {
		PrgAtom* a = getAtom(propQ_[i]);
		if (!a->relevant()) { continue; }
		if (!a->propagateValue(*this, backprop)) {
			setConflict();
			return false;
		}
		if (a->hasVar() && a->id() < startAtom() && !ctx()->addUnary(a->trueLit())) {
			setConflict();
			return false;
		}
	}
	opts_.backprop = oldB;
	propQ_.clear();
	return true;
}